

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerBase.cpp
# Opt level: O3

void Diligent::ValidateSamplerDesc(SamplerDesc *Desc,IRenderDevice *pDevice)

{
  FILTER_TYPE FVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_stack_ffffffffffffffb8) [57];
  uint local_40;
  uint local_3c;
  string _msg;
  long lVar4;
  
  iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  iVar3 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  lVar4 = CONCAT44(extraout_var_00,iVar3);
  if (((Desc->Flags & (SAMPLER_FLAG_LAST|SAMPLER_FLAG_SUBSAMPLED)) != SAMPLER_FLAG_NONE) &&
     ((*(byte *)(lVar4 + 0x155) & 0x10) == 0)) {
    LogError<true,char[25],char_const*,char[15],char[87]>
              (false,"ValidateSamplerDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
               ,0x31,(char (*) [25])"Description of sampler \'",(char **)Desc,
               (char (*) [15])"\' is invalid: ",
               (char (*) [87])
               "Subsampled sampler requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability."
              );
  }
  if (Desc->UnnormalizedCoords == true) {
    if (1 < *(int *)CONCAT44(extraout_var,iVar2) - 5U) {
      LogError<true,char[25],char_const*,char[15],char[65]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x36,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [65])"Unnormalized coordinates are only supported in Vulkan and Metal.");
    }
    if (Desc->MinFilter != Desc->MagFilter) {
      LogError<true,char[25],char_const*,char[15],char[72]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x38,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [72])
                 "When UnnormalizedCoords is true, MinFilter and MagFilter must be equal.");
    }
    if (Desc->MipFilter != FILTER_TYPE_POINT) {
      LogError<true,char[25],char_const*,char[15],char[70]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x39,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [70])
                 "When UnnormalizedCoords is true, MipFilter must be FILTER_TYPE_POINT.");
    }
    if (1 < (byte)(Desc->AddressU - TEXTURE_ADDRESS_CLAMP)) {
      LogError<true,char[25],char_const*,char[15],char[67]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3a,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [67])"When UnnormalizedCoords is true, AddressU must be CLAMP or BORDER."
                );
    }
    if (1 < (byte)(Desc->AddressV - TEXTURE_ADDRESS_CLAMP)) {
      LogError<true,char[25],char_const*,char[15],char[67]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3b,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [67])"When UnnormalizedCoords is true, AddressV must be CLAMP or BORDER."
                );
    }
    FVar1 = Desc->MinFilter;
    if ((byte)(FVar1 - FILTER_TYPE_COMPARISON_POINT) < 3) {
      LogError<true,char[25],char_const*,char[15],char[81]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3c,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [81])
                 "When UnnormalizedCoords is true, MinFilter and MagFilter must not be comparison.")
      ;
      FVar1 = Desc->MinFilter;
    }
    if ((FVar1 < FILTER_TYPE_NUM_FILTERS) && ((0x1248U >> (FVar1 & 0x1f) & 1) != 0)) {
      LogError<true,char[25],char_const*,char[15],char[82]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3d,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [82])
                 "When UnnormalizedCoords is true, MinFilter and MagFilter must not be anisotropic."
                );
    }
  }
  if ((Desc->MinFilter < 0xd) && ((0x1248U >> (Desc->MinFilter & 0x1f) & 1) != 0)) {
    if ((uint)*(byte *)(lVar4 + 0x12d) < Desc->MaxAnisotropy) {
      local_40 = (uint)*(byte *)(lVar4 + 0x12d);
      local_3c = Desc->MaxAnisotropy;
      FormatString<char[16],unsigned_int,char[26],char_const*,char[45],unsigned_int,char[57]>
                (&_msg,(Diligent *)"MaxAnisotropy (",(char (*) [16])&local_3c,
                 (uint *)") requested for sampler \'",(char (*) [26])Desc,
                 (char **)"\' exceeds the maximum supported anisotropy (",(char (*) [45])&local_40,
                 (uint *)"). Check the value of AdapterInfo.Sampler.MaxAnisotropy.",
                 in_stack_ffffffffffffffb8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (*(char *)(lVar4 + 300) == '\0') {
    if (Desc->AddressU == TEXTURE_ADDRESS_BORDER) {
      LogError<true,char[25],char_const*,char[15],char[112]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x4a,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [112])
                 "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property"
                );
    }
    if (Desc->AddressV == TEXTURE_ADDRESS_BORDER) {
      LogError<true,char[25],char_const*,char[15],char[112]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x4b,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [112])
                 "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property"
                );
    }
    if (Desc->AddressW == TEXTURE_ADDRESS_BORDER) {
      LogError<true,char[25],char_const*,char[15],char[112]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x4c,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [112])
                 "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property"
                );
    }
  }
  return;
}

Assistant:

void ValidateSamplerDesc(const SamplerDesc& Desc, const IRenderDevice* pDevice)
{
    const RenderDeviceInfo&    DeviceInfo  = pDevice->GetDeviceInfo();
    const GraphicsAdapterInfo& AdapterInfo = pDevice->GetAdapterInfo();
    if (Desc.Flags & (SAMPLER_FLAG_SUBSAMPLED | SAMPLER_FLAG_SUBSAMPLED_COARSE_RECONSTRUCTION))
    {
        VERIFY_SAMPLER(AdapterInfo.ShadingRate.CapFlags & SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET,
                       "Subsampled sampler requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability.");
    }
    if (Desc.UnnormalizedCoords)
    {
        VERIFY_SAMPLER(DeviceInfo.IsVulkanDevice() || DeviceInfo.IsMetalDevice(),
                       "Unnormalized coordinates are only supported in Vulkan and Metal.");

        VERIFY_SAMPLER(Desc.MinFilter == Desc.MagFilter, "When UnnormalizedCoords is true, MinFilter and MagFilter must be equal.");
        VERIFY_SAMPLER(Desc.MipFilter == FILTER_TYPE_POINT, "When UnnormalizedCoords is true, MipFilter must be FILTER_TYPE_POINT.");
        VERIFY_SAMPLER(Desc.AddressU == TEXTURE_ADDRESS_CLAMP || Desc.AddressU == TEXTURE_ADDRESS_BORDER, "When UnnormalizedCoords is true, AddressU must be CLAMP or BORDER.");
        VERIFY_SAMPLER(Desc.AddressV == TEXTURE_ADDRESS_CLAMP || Desc.AddressV == TEXTURE_ADDRESS_BORDER, "When UnnormalizedCoords is true, AddressV must be CLAMP or BORDER.");
        VERIFY_SAMPLER(!IsComparisonFilter(Desc.MinFilter), "When UnnormalizedCoords is true, MinFilter and MagFilter must not be comparison.");
        VERIFY_SAMPLER(!IsAnisotropicFilter(Desc.MinFilter), "When UnnormalizedCoords is true, MinFilter and MagFilter must not be anisotropic.");
    }
    if (IsAnisotropicFilter(Desc.MinFilter))
    {
        if (Desc.MaxAnisotropy > AdapterInfo.Sampler.MaxAnisotropy)
        {
            LOG_WARNING_MESSAGE("MaxAnisotropy (", Uint32{Desc.MaxAnisotropy}, ") requested for sampler '", Desc.Name,
                                "' exceeds the maximum supported anisotropy (", Uint32{AdapterInfo.Sampler.MaxAnisotropy},
                                "). Check the value of AdapterInfo.Sampler.MaxAnisotropy.");
        }
    }
    if (!AdapterInfo.Sampler.BorderSamplingModeSupported)
    {
        VERIFY_SAMPLER(Desc.AddressU != TEXTURE_ADDRESS_BORDER, "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property");
        VERIFY_SAMPLER(Desc.AddressV != TEXTURE_ADDRESS_BORDER, "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property");
        VERIFY_SAMPLER(Desc.AddressW != TEXTURE_ADDRESS_BORDER, "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property");
    }
}